

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dataset_metadata.cpp
# Opt level: O3

void __thiscall
dlib::image_dataset_metadata::doc_handler::end_element
          (doc_handler *this,unsigned_long param_1,string *name)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  pointer pbVar4;
  uint *local_e8;
  undefined8 uStack_e0;
  uint local_d8 [4];
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  pointer local_b8;
  _Base_ptr local_b0;
  _Base_ptr p_Stack_a8;
  size_t local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined4 uStack_74;
  double dStack_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  double dStack_50;
  vector<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
  local_48;
  
  pbVar1 = (this->ts).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = pbVar1 + -1;
  (this->ts).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  pcVar2 = pbVar1[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pbVar1[-1].field_2) {
    operator_delete(pcVar2);
    pbVar4 = (this->ts).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pbVar4 != (this->ts).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if ((iVar3 == 0) &&
       (iVar3 = std::__cxx11::string::compare
                          ((char *)((this->ts).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1)), iVar3 == 0))
    {
      std::
      vector<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ::push_back(&(this->temp_image).boxes,&this->temp_box);
      local_e8 = (uint *)0x0;
      uStack_e0 = 0;
      local_d8[0] = 0xffffffff;
      local_d8[1] = 0xffffffff;
      local_d8[2] = 0xffffffff;
      local_d8[3] = 0xffffffff;
      uStack_c0 = (pointer)((ulong)uStack_c0._4_4_ << 0x20);
      local_b8 = (pointer)0x0;
      local_a0 = 0;
      local_90 = 0;
      local_88[0] = 0;
      dStack_50 = 0.0;
      local_78 = 0;
      dStack_70 = 0.0;
      uStack_68 = 0;
      uStack_64 = 0;
      uStack_60 = 0;
      uStack_5c = 0;
      local_58 = 0;
      *(undefined4 *)&(this->temp_box).rect.r = 0xffffffff;
      *(undefined4 *)((long)&(this->temp_box).rect.r + 4) = 0xffffffff;
      *(undefined4 *)&(this->temp_box).rect.b = 0xffffffff;
      *(undefined4 *)((long)&(this->temp_box).rect.b + 4) = 0xffffffff;
      (this->temp_box).rect.l = 0;
      (this->temp_box).rect.t = 0;
      local_b0 = (_Base_ptr)&uStack_c0;
      p_Stack_a8 = (_Base_ptr)&uStack_c0;
      local_98 = local_88;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
      ::clear(&(this->temp_box).parts._M_t);
      if (local_b8 != (pointer)0x0) {
        (this->temp_box).parts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)uStack_c0;
        (this->temp_box).parts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_b8;
        (this->temp_box).parts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_b0;
        (this->temp_box).parts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_a8;
        (local_b8->rect).t = (long)&(this->temp_box).parts._M_t._M_impl.super__Rb_tree_header;
        (this->temp_box).parts._M_t._M_impl.super__Rb_tree_header._M_node_count = local_a0;
        local_b8 = (pointer)0x0;
        local_a0 = 0;
        local_b0 = (_Base_ptr)&uStack_c0;
        p_Stack_a8 = (_Base_ptr)&uStack_c0;
      }
      std::__cxx11::string::operator=((string *)&(this->temp_box).label,(string *)&local_98);
      *(ulong *)&(this->temp_box).gender = CONCAT44(uStack_54,local_58);
      (this->temp_box).age = dStack_50;
      (this->temp_box).detection_score = (double)CONCAT44(uStack_64,uStack_68);
      (this->temp_box).angle = (double)CONCAT44(uStack_5c,uStack_60);
      (this->temp_box).difficult = (bool)(char)local_78;
      (this->temp_box).truncated = (bool)(char)((uint)local_78 >> 8);
      (this->temp_box).occluded = (bool)(char)((uint)local_78 >> 0x10);
      (this->temp_box).ignore = (bool)(char)((uint)local_78 >> 0x18);
      *(undefined4 *)&(this->temp_box).field_0x74 = uStack_74;
      (this->temp_box).pose = dStack_70;
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
                   *)local_c8);
      return;
    }
    iVar3 = std::__cxx11::string::compare((char *)name);
    if ((iVar3 == 0) &&
       (iVar3 = std::__cxx11::string::compare
                          ((char *)((this->ts).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1)), iVar3 == 0))
    {
      std::
      vector<dlib::image_dataset_metadata::image,_std::allocator<dlib::image_dataset_metadata::image>_>
      ::push_back(&this->meta->images,&this->temp_image);
      uStack_e0 = 0;
      local_d8[0] = local_d8[0] & 0xffffff00;
      local_c8 = (undefined1  [8])0x0;
      uStack_c0 = (pointer)0x0;
      local_b8 = (pointer)0x0;
      local_e8 = local_d8;
      std::__cxx11::string::operator=((string *)&this->temp_image,(string *)&local_e8);
      local_48.
      super__Vector_base<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (this->temp_image).boxes.
           super__Vector_base<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->temp_image).boxes.
      super__Vector_base<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_b8;
      local_48.
      super__Vector_base<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (this->temp_image).boxes.
           super__Vector_base<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (this->temp_image).boxes.
           super__Vector_base<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->temp_image).boxes.
      super__Vector_base<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8;
      (this->temp_image).boxes.
      super__Vector_base<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ._M_impl.super__Vector_impl_data._M_finish = uStack_c0;
      local_c8 = (undefined1  [8])0x0;
      uStack_c0 = (pointer)0x0;
      local_b8 = (pointer)0x0;
      std::
      vector<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ::~vector(&local_48);
      std::
      vector<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
      ::~vector((vector<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
                 *)local_c8);
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
    }
  }
  return;
}

Assistant:

virtual void end_element ( 
                const unsigned long ,
                const std::string& name
            )
            {
                ts.pop_back();
                if (ts.size() == 0)
                    return;

                if (name == "box" && ts.back() == "image")
                {
                    temp_image.boxes.push_back(temp_box);
                    temp_box = box();
                }
                else if (name == "image" && ts.back() == "images")
                {
                    meta.images.push_back(temp_image);
                    temp_image = image();
                }
            }